

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,SocketError error)

{
  long *plVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  QDebug *pQVar2;
  storage_type *psVar3;
  Stream *pSVar4;
  QTextStream *pQVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QDebugStateSaver saver;
  undefined1 *local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  pQVar2 = (QDebug *)CONCAT44(in_register_00000034,error);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,pQVar2);
  plVar1 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar1 + 0x30) = 0;
  pQVar5 = (QTextStream *)pQVar2->stream;
  switch(in_EDX) {
  case 0:
    psVar3 = (storage_type *)0x27;
    break;
  case 1:
    goto LAB_001c21b8;
  case 2:
    goto LAB_001c21e7;
  case 3:
    goto LAB_001c21e7;
  case 4:
    psVar3 = (storage_type *)0x24;
    break;
  case 5:
    goto LAB_001c220d;
  case 6:
LAB_001c21b8:
    psVar3 = (storage_type *)0x26;
    break;
  case 7:
    psVar3 = (storage_type *)0x1d;
    break;
  case 8:
LAB_001c21e7:
    psVar3 = (storage_type *)0x22;
    break;
  case 9:
    goto LAB_001c2145;
  case 10:
    psVar3 = (storage_type *)0x30;
    break;
  case 0xb:
LAB_001c2145:
    psVar3 = (storage_type *)0x2f;
    break;
  case 0xc:
    psVar3 = (storage_type *)0x31;
    break;
  default:
    QVar7.m_data = (storage_type *)0x1d;
    QVar7.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<(pQVar5,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    pQVar5 = (QTextStream *)pQVar2->stream;
    if (pQVar5[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar5,' ');
      pQVar5 = (QTextStream *)pQVar2->stream;
    }
    QTextStream::operator<<(pQVar5,in_EDX);
    pQVar5 = (QTextStream *)pQVar2->stream;
    if (pQVar5[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar5,' ');
      pQVar5 = (QTextStream *)pQVar2->stream;
    }
    QTextStream::operator<<(pQVar5,')');
    pSVar4 = pQVar2->stream;
    if (pSVar4[0x30] != (Stream)0x1) goto LAB_001c2272;
    goto LAB_001c2268;
  case 0xe:
    goto LAB_001c2220;
  case 0xf:
    psVar3 = (storage_type *)0x2b;
    break;
  case 0x10:
LAB_001c2220:
    psVar3 = (storage_type *)0x2c;
    break;
  case 0x11:
    goto LAB_001c220d;
  case 0x12:
LAB_001c220d:
    psVar3 = (storage_type *)0x23;
    break;
  case -1:
    goto LAB_001c220d;
  }
  QVar6.m_data = psVar3;
  QVar6.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<(pQVar5,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pSVar4 = pQVar2->stream;
  if (pSVar4[0x30] != (Stream)0x0) {
LAB_001c2268:
    QTextStream::operator<<((QTextStream *)pSVar4,' ');
  }
LAB_001c2272:
  pSVar4 = pQVar2->stream;
  pQVar2->stream = (Stream *)0x0;
  *(Stream **)debug.stream = pSVar4;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

Q_NETWORK_EXPORT QDebug operator<<(QDebug debug, QAbstractSocket::SocketError error)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    switch (error) {
    case QAbstractSocket::ConnectionRefusedError:
        debug << "QAbstractSocket::ConnectionRefusedError";
        break;
    case QAbstractSocket::RemoteHostClosedError:
        debug << "QAbstractSocket::RemoteHostClosedError";
        break;
    case QAbstractSocket::HostNotFoundError:
        debug << "QAbstractSocket::HostNotFoundError";
        break;
    case QAbstractSocket::SocketAccessError:
        debug << "QAbstractSocket::SocketAccessError";
        break;
    case QAbstractSocket::SocketResourceError:
        debug << "QAbstractSocket::SocketResourceError";
        break;
    case QAbstractSocket::SocketTimeoutError:
        debug << "QAbstractSocket::SocketTimeoutError";
        break;
    case QAbstractSocket::DatagramTooLargeError:
        debug << "QAbstractSocket::DatagramTooLargeError";
        break;
    case QAbstractSocket::NetworkError:
        debug << "QAbstractSocket::NetworkError";
        break;
    case QAbstractSocket::AddressInUseError:
        debug << "QAbstractSocket::AddressInUseError";
        break;
    case QAbstractSocket::SocketAddressNotAvailableError:
        debug << "QAbstractSocket::SocketAddressNotAvailableError";
        break;
    case QAbstractSocket::UnsupportedSocketOperationError:
        debug << "QAbstractSocket::UnsupportedSocketOperationError";
        break;
    case QAbstractSocket::UnfinishedSocketOperationError:
        debug << "QAbstractSocket::UnfinishedSocketOperationError";
        break;
    case QAbstractSocket::ProxyAuthenticationRequiredError:
        debug << "QAbstractSocket::ProxyAuthenticationRequiredError";
        break;
    case QAbstractSocket::UnknownSocketError:
        debug << "QAbstractSocket::UnknownSocketError";
        break;
    case QAbstractSocket::ProxyConnectionRefusedError:
        debug << "QAbstractSocket::ProxyConnectionRefusedError";
        break;
    case QAbstractSocket::ProxyConnectionClosedError:
        debug << "QAbstractSocket::ProxyConnectionClosedError";
        break;
    case QAbstractSocket::ProxyConnectionTimeoutError:
        debug << "QAbstractSocket::ProxyConnectionTimeoutError";
        break;
    case QAbstractSocket::ProxyNotFoundError:
        debug << "QAbstractSocket::ProxyNotFoundError";
        break;
    case QAbstractSocket::ProxyProtocolError:
        debug << "QAbstractSocket::ProxyProtocolError";
        break;
    default:
        debug << "QAbstractSocket::SocketError(" << int(error) << ')';
        break;
    }
    return debug;
}